

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket.c
# Opt level: O1

PSocket * p_socket_new_from_fd(pint fd,PError **error)

{
  int iVar1;
  uint uVar2;
  uint *mem;
  PSocket *pPVar3;
  uint uVar4;
  socklen_t optlen;
  socklen_t addrlen;
  pint value;
  PSocketFamily family;
  sockaddr_storage address;
  socklen_t local_ac;
  socklen_t local_a8 [2];
  int local_a0;
  undefined1 local_9c [4];
  sockaddr local_98 [8];
  
  if (fd < 0) {
    p_socket_new_from_fd_cold_7();
  }
  else {
    mem = (uint *)p_malloc0(0x1c);
    if (mem == (uint *)0x0) {
      p_socket_new_from_fd_cold_6();
    }
    else {
      mem[3] = fd;
      uVar4 = mem[3];
      local_ac = 4;
      iVar1 = getsockopt(uVar4,1,3,&local_a0,&local_ac);
      if (iVar1 == 0) {
        if (local_ac == 4) {
          uVar2 = 0;
          if (local_a0 - 1U < 5) {
            uVar2 = *(uint *)(&DAT_00117c84 + (ulong)(local_a0 - 1U) * 4);
          }
          mem[2] = uVar2;
          local_a8[0] = 0x80;
          iVar1 = getsockname(uVar4,local_98,local_a8);
          if (iVar1 == 0) {
            if (local_a8[0] != 0) {
LAB_00114fae:
              uVar4 = 10;
              if (local_98[0].sa_family != 10) {
                uVar4 = 0;
              }
              uVar2 = 2;
              if (local_98[0].sa_family != 2) {
                uVar2 = uVar4;
              }
              *mem = uVar2;
              pPVar3 = (PSocket *)
                       (*(code *)(&DAT_00117c6c + *(int *)(&DAT_00117c6c + (ulong)(uVar2 >> 1) * 4))
                       )();
              return pPVar3;
            }
            local_ac = 4;
            iVar1 = getsockopt(mem[3],1,0x27,local_9c,&local_ac);
            if (iVar1 == 0) goto LAB_00114fae;
            p_socket_new_from_fd_cold_4();
          }
          else {
            p_socket_new_from_fd_cold_3();
          }
        }
        else {
          p_socket_new_from_fd_cold_2();
        }
      }
      else {
        p_socket_new_from_fd_cold_1();
      }
      p_free(mem);
    }
  }
  return (PSocket *)0x0;
}

Assistant:

P_LIB_API PSocket *
p_socket_new_from_fd (pint	fd,
		      PError	**error)
{
	PSocket	*ret;
#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	pint	flags;
#endif

	if (P_UNLIKELY (fd < 0)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_INVALID_ARGUMENT,
				     0,
				     "Unable to create socket from bad fd");
		return NULL;
	}

	if (P_UNLIKELY ((ret = p_malloc0 (sizeof (PSocket))) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for socket");
		return NULL;
	}

	ret->fd = fd;

	if (P_UNLIKELY (pp_socket_set_details_from_fd (ret, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

	if (P_UNLIKELY (pp_socket_set_fd_blocking (ret->fd, FALSE, error) == FALSE)) {
		p_free (ret);
		return NULL;
	}

#if !defined (P_OS_WIN) && defined (SO_NOSIGPIPE)
	flags = 1;

	if (setsockopt (ret->fd, SOL_SOCKET, SO_NOSIGPIPE, &flags, sizeof (flags)) < 0)
		P_WARNING ("PSocket::p_socket_new_from_fd: setsockopt() with SO_NOSIGPIPE failed");
#endif

	p_socket_set_listen_backlog (ret, P_SOCKET_DEFAULT_BACKLOG);

	ret->timeout  = 0;
	ret->blocking = TRUE;

#ifdef P_OS_SCO
	if (P_UNLIKELY ((ret->timer = p_time_profiler_new ()) == NULL)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_NO_RESOURCES,
				     0,
				     "Failed to allocate memory for internal timer");
		p_free (ret);
		return NULL;
	}
#endif

#ifdef P_OS_WIN
	if (P_UNLIKELY ((ret->events = WSACreateEvent ()) == WSA_INVALID_EVENT)) {
		p_error_set_error_p (error,
				     (pint) P_ERROR_IO_FAILED,
				     (pint) p_error_get_last_net (),
				     "Failed to call WSACreateEvent() on socket");
		p_free (ret);
		return NULL;
	}
#endif

	return ret;
}